

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Comparator *pCVar4;
  uint64_t uVar5;
  char *__s;
  size_type in_RDX;
  long in_FS_OFFSET;
  uint64_t tag;
  char *key_ptr;
  char *entry;
  Slice v;
  uint32_t key_length;
  Iterator iter;
  Slice memkey;
  Slice *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  LookupKey *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  byte local_d0;
  bool local_91;
  Slice local_58;
  undefined1 local_48 [24];
  char *local_30;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = LookupKey::memtable_key(in_stack_ffffffffffffff08);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Iterator
            ((Iterator *)in_stack_fffffffffffffef8,
             (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)0x18a6eaa);
  local_30 = Slice::data(in_stack_fffffffffffffef8);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek
            ((Iterator *)in_stack_ffffffffffffff08,
             (char **)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  bVar1 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Valid
                    ((Iterator *)in_stack_fffffffffffffef8);
  if (bVar1) {
    SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key
              ((Iterator *)in_stack_ffffffffffffff08);
    GetVarint32Ptr(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                   (uint32_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    pCVar4 = InternalKeyComparator::user_comparator
                       ((InternalKeyComparator *)in_stack_fffffffffffffef8);
    Slice::Slice((Slice *)in_stack_ffffffffffffff08,
                 (char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 (size_t)in_stack_fffffffffffffef8);
    local_58 = LookupKey::user_key(in_stack_ffffffffffffff08);
    iVar2 = (*pCVar4->_vptr_Comparator[2])(pCVar4,local_48,&local_58);
    if (iVar2 == 0) {
      uVar5 = DecodeFixed64((char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      local_d0 = (byte)uVar5;
      uVar3 = (uint)local_d0;
      if (uVar3 == 0) {
        Slice::Slice(in_stack_fffffffffffffef8);
        Slice::Slice(in_stack_fffffffffffffef8);
        Status::NotFound((Slice *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffef8);
        Status::operator=((Status *)in_stack_ffffffffffffff08,
                          (Status *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        Status::~Status((Status *)in_stack_fffffffffffffef8);
        local_91 = true;
        goto LAB_018a708b;
      }
      if (uVar3 == 1) {
        GetLengthPrefixedSlice(in_stack_ffffffffffffff10);
        __s = Slice::data(in_stack_fffffffffffffef8);
        Slice::size(in_stack_fffffffffffffef8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar3,in_stack_ffffffffffffff18),__s,in_RDX);
        local_91 = true;
        goto LAB_018a708b;
      }
    }
  }
  local_91 = false;
LAB_018a708b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool MemTable::Get(const LookupKey& key, std::string* value, Status* s) {
  Slice memkey = key.memtable_key();
  Table::Iterator iter(&table_);
  iter.Seek(memkey.data());
  if (iter.Valid()) {
    // entry format is:
    //    klength  varint32
    //    userkey  char[klength]
    //    tag      uint64
    //    vlength  varint32
    //    value    char[vlength]
    // Check that it belongs to same user key.  We do not check the
    // sequence number since the Seek() call above should have skipped
    // all entries with overly large sequence numbers.
    const char* entry = iter.key();
    uint32_t key_length;
    const char* key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
    if (comparator_.comparator.user_comparator()->Compare(
            Slice(key_ptr, key_length - 8), key.user_key()) == 0) {
      // Correct user key
      const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
      switch (static_cast<ValueType>(tag & 0xff)) {
        case kTypeValue: {
          Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
          value->assign(v.data(), v.size());
          return true;
        }
        case kTypeDeletion:
          *s = Status::NotFound(Slice());
          return true;
      }
    }
  }
  return false;
}